

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::SamplerTest::initPrograms
          (SamplerTest *this,SourceCollections *sourceCollections)

{
  bool bVar1;
  CompressedTexFormat format_00;
  ostream *poVar2;
  void *this_00;
  ProgramSources *pPVar3;
  VkImageViewType in_ECX;
  VkImageViewType VVar4;
  string local_448;
  ShaderSource local_428;
  allocator<char> local_3f9;
  string local_3f8;
  string local_3d8;
  ShaderSource local_3b8;
  allocator<char> local_389;
  string local_388;
  string local_368;
  undefined1 local_348 [8];
  Vec4 lookupBias;
  Vec4 lookupScale;
  TextureFormat format;
  char *texCoordSwizzle;
  ostringstream local_308 [8];
  ostringstream fragmentSrc;
  ostringstream local_190 [8];
  ostringstream vertexSrc;
  SourceCollections *sourceCollections_local;
  SamplerTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_308);
  format.order = R;
  format.type = SNORM_INT8;
  bVar1 = ::vk::isCompressedFormat(this->m_imageFormat);
  if (bVar1) {
    format_00 = ::vk::mapVkCompressedFormat(this->m_imageFormat);
    lookupScale.m_data._8_8_ = tcu::getUncompressedFormat(format_00);
  }
  else {
    lookupScale.m_data._8_8_ = ::vk::mapVkFormat(this->m_imageFormat);
  }
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(lookupBias.m_data + 2));
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_348);
  getLookupScaleBias(this->m_imageFormat,(Vec4 *)(lookupBias.m_data + 2),(Vec4 *)local_348);
  VVar4 = 0x12df600;
  switch(this->m_imageViewType) {
  case VK_IMAGE_VIEW_TYPE_1D:
    format = (TextureFormat)((long)"%x" + 1);
    in_ECX = VVar4;
    break;
  case VK_IMAGE_VIEW_TYPE_2D:
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    format = (TextureFormat)((long)".xy" + 1);
    in_ECX = VVar4;
    break;
  case VK_IMAGE_VIEW_TYPE_3D:
  case VK_IMAGE_VIEW_TYPE_CUBE:
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    format = (TextureFormat)((long)".xyz" + 1);
    in_ECX = VVar4;
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
    format = (TextureFormat)anon_var_dwarf_347ed9;
    in_ECX = VVar4;
  }
  poVar2 = std::operator<<((ostream *)local_190,"#version 440\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in vec4 position;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 1) in vec4 texCoords;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out highp vec4 vtxTexCoords;\n");
  poVar2 = std::operator<<(poVar2,"out gl_PerVertex {\n");
  poVar2 = std::operator<<(poVar2,"\tvec4 gl_Position;\n");
  poVar2 = std::operator<<(poVar2,"};\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\tgl_Position = position;\n");
  poVar2 = std::operator<<(poVar2,"\tvtxTexCoords = texCoords;\n");
  std::operator<<(poVar2,"}\n");
  poVar2 = std::operator<<((ostream *)local_308,"#version 440\n");
  poVar2 = std::operator<<(poVar2,"layout(set = 0, binding = 0) uniform highp ");
  pipeline::(anonymous_namespace)::SamplerTest::getGlslSamplerType_abi_cxx11_
            (&local_368,(SamplerTest *)(lookupScale.m_data + 2),
             (TextureFormat *)(ulong)this->m_imageViewType,in_ECX);
  poVar2 = std::operator<<(poVar2,(string *)&local_368);
  poVar2 = std::operator<<(poVar2," texSampler;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in highp vec4 vtxTexCoords;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out highp vec4 fragColor;\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  std::operator<<(poVar2,"\tfragColor = ");
  std::__cxx11::string::~string((string *)&local_368);
  if (this->m_samplerLod <= 0.0) {
    poVar2 = std::operator<<((ostream *)local_308,"texture(texSampler, vtxTexCoords.");
    poVar2 = std::operator<<(poVar2,(char *)format);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::fixed);
  }
  else {
    poVar2 = std::operator<<((ostream *)local_308,"textureLod(texSampler, vtxTexCoords.");
    poVar2 = std::operator<<(poVar2,(char *)format);
    poVar2 = std::operator<<(poVar2,", ");
    this_00 = (void *)std::ostream::operator<<(poVar2,std::fixed);
    poVar2 = (ostream *)std::ostream::operator<<(this_00,this->m_samplerLod);
    std::operator<<(poVar2,")");
  }
  poVar2 = std::operator<<((ostream *)local_308," * vec4");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::scientific);
  poVar2 = tcu::operator<<(poVar2,(Vector<float,_4> *)(lookupBias.m_data + 2));
  poVar2 = std::operator<<(poVar2," + vec4");
  poVar2 = tcu::operator<<(poVar2,(Vector<float,_4> *)local_348);
  poVar2 = std::operator<<(poVar2,";\n");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"tex_vert",&local_389);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_388);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_3b8,&local_3d8);
  glu::ProgramSources::operator<<(pPVar3,&local_3b8);
  glu::VertexSource::~VertexSource((VertexSource *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"tex_frag",&local_3f9);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_3f8);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_428,&local_448);
  glu::ProgramSources::operator<<(pPVar3,&local_428);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_428);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  std::__cxx11::ostringstream::~ostringstream(local_308);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void SamplerTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream				vertexSrc;
	std::ostringstream				fragmentSrc;
	const char*						texCoordSwizzle	= DE_NULL;
	tcu::TextureFormat				format			= (isCompressedFormat(m_imageFormat)) ? tcu::getUncompressedFormat(mapVkCompressedFormat(m_imageFormat))
																						  : mapVkFormat(m_imageFormat);
	tcu::Vec4						lookupScale;
	tcu::Vec4						lookupBias;

	getLookupScaleBias(m_imageFormat, lookupScale, lookupBias);

	switch (m_imageViewType)
	{
		case VK_IMAGE_VIEW_TYPE_1D:
			texCoordSwizzle = "x";
			break;
		case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
		case VK_IMAGE_VIEW_TYPE_2D:
			texCoordSwizzle = "xy";
			break;
		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
		case VK_IMAGE_VIEW_TYPE_3D:
		case VK_IMAGE_VIEW_TYPE_CUBE:
			texCoordSwizzle = "xyz";
			break;
		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			texCoordSwizzle = "xyzw";
			break;
		default:
			DE_ASSERT(false);
			break;
	}

	vertexSrc << "#version 440\n"
			  << "layout(location = 0) in vec4 position;\n"
			  << "layout(location = 1) in vec4 texCoords;\n"
			  << "layout(location = 0) out highp vec4 vtxTexCoords;\n"
			  << "out gl_PerVertex {\n"
			  << "	vec4 gl_Position;\n"
			  << "};\n"
			  << "void main (void)\n"
			  << "{\n"
			  << "	gl_Position = position;\n"
			  << "	vtxTexCoords = texCoords;\n"
			  << "}\n";

	fragmentSrc << "#version 440\n"
				<< "layout(set = 0, binding = 0) uniform highp " << getGlslSamplerType(format, m_imageViewType) << " texSampler;\n"
				<< "layout(location = 0) in highp vec4 vtxTexCoords;\n"
				<< "layout(location = 0) out highp vec4 fragColor;\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "	fragColor = ";

	if (m_samplerLod > 0.0f)
		fragmentSrc << "textureLod(texSampler, vtxTexCoords." << texCoordSwizzle << ", " << std::fixed <<  m_samplerLod << ")";
	else
		fragmentSrc << "texture(texSampler, vtxTexCoords." << texCoordSwizzle << ")" << std::fixed;

	fragmentSrc << " * vec4" << std::scientific << lookupScale << " + vec4" << lookupBias << ";\n"
				<< "}\n";

	sourceCollections.glslSources.add("tex_vert") << glu::VertexSource(vertexSrc.str());
	sourceCollections.glslSources.add("tex_frag") << glu::FragmentSource(fragmentSrc.str());
}